

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_tests.cpp
# Opt level: O0

void __thiscall bech32_tests::bech32_testvectors_valid::test_method(bech32_testvectors_valid *this)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  string *str;
  string *__end1;
  string *__begin1;
  string (*__range1) [7];
  string recode;
  DecodeResult dec;
  DecodeResult *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  assertion_result *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  string *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  const_string *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  char *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  CharLimit in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffdd0;
  string *local_208;
  lazy_ostream local_1b8 [2];
  assertion_result local_198 [2];
  lazy_ostream local_140 [2];
  assertion_result local_120 [2];
  const_string local_e8 [2];
  lazy_ostream local_c8 [2];
  assertion_result local_a8 [2];
  undefined1 local_6f [2];
  allocator<char> local_6d;
  allocator<char> local_6c;
  allocator<char> local_6b;
  undefined1 local_6a [98];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((test_method()::CASES_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&test_method()::CASES_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    in_stack_fffffffffffffdc8 = 0x23d39c0;
    in_stack_fffffffffffffdd0 = (string *)local_6a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    in_stack_fffffffffffffd88 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    in_stack_fffffffffffffd78 = test_method()::CASES_abi_cxx11_ + 6;
    in_stack_fffffffffffffd80 = (string *)local_6f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
    std::allocator<char>::~allocator((allocator<char> *)local_6f);
    std::allocator<char>::~allocator((allocator<char> *)(local_6f + 1));
    std::allocator<char>::~allocator(&local_6d);
    std::allocator<char>::~allocator(&local_6c);
    std::allocator<char>::~allocator(&local_6b);
    std::allocator<char>::~allocator((allocator<char> *)local_6a);
    std::allocator<char>::~allocator((allocator<char> *)(local_6a + 1));
    __cxa_atexit(::__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&test_method()::CASES_abi_cxx11_);
  }
  for (local_208 = test_method()::CASES_abi_cxx11_;
      local_208 != (string *)&test_method()::CASES_abi_cxx11_; local_208 = local_208 + 1) {
    bech32::Decode(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                 (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (unsigned_long)in_stack_fffffffffffffd08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd08);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 in_stack_fffffffffffffd40,
                 CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                 (const_string *)in_stack_fffffffffffffd30);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                 (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (unsigned_long)in_stack_fffffffffffffd08);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffd08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                 (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (unsigned_long)in_stack_fffffffffffffd08);
      in_stack_fffffffffffffd08 = (DecodeResult *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_a8,local_c8,local_e8,0x1c,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffd08);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffd08);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bech32::Encode((Encoding)((ulong)in_stack_fffffffffffffd88 >> 0x20),in_stack_fffffffffffffd80,
                   (data *)in_stack_fffffffffffffd78);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                 (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (unsigned_long)in_stack_fffffffffffffd08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd08);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 in_stack_fffffffffffffd40,
                 CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                 (const_string *)in_stack_fffffffffffffd30);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd08);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                 (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (unsigned_long)in_stack_fffffffffffffd08);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffd08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                 (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (unsigned_long)in_stack_fffffffffffffd08);
      in_stack_fffffffffffffd08 = (DecodeResult *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_120,local_140,(const_string *)&stack0xfffffffffffffea0,0x1e,CHECK,CHECK_PRED)
      ;
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffd08);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffd08);
      in_stack_fffffffffffffd4f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffd4f);
    do {
      in_stack_fffffffffffffd40 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                 (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (unsigned_long)in_stack_fffffffffffffd08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd08);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                 in_stack_fffffffffffffd40,
                 CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                 (const_string *)in_stack_fffffffffffffd30);
      in_stack_fffffffffffffd3f =
           CaseInsensitiveEqual
                     (in_stack_fffffffffffffd30,
                      (string *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffd18,(bool)in_stack_fffffffffffffd17);
      in_stack_fffffffffffffd30 = (string *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                 (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (unsigned_long)in_stack_fffffffffffffd08);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffd08);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd18,
                 (pointer)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 (unsigned_long)in_stack_fffffffffffffd08);
      in_stack_fffffffffffffd08 = (DecodeResult *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_198,local_1b8,(const_string *)&stack0xfffffffffffffe28,0x1f,CHECK,CHECK_PRED)
      ;
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffd08);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffd08);
      in_stack_fffffffffffffd2f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffd2f);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd08);
    bech32::DecodeResult::~DecodeResult(in_stack_fffffffffffffd08);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bech32_testvectors_valid)
{
    static const std::string CASES[] = {
        "A12UEL5L",
        "a12uel5l",
        "an83characterlonghumanreadablepartthatcontainsthenumber1andtheexcludedcharactersbio1tt5tgs",
        "abcdef1qpzry9x8gf2tvdw0s3jn54khce6mua7lmqqqxw",
        "11qqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqc8247j",
        "split1checkupstagehandshakeupstreamerranterredcaperred2y9e3w",
        "?1ezyfcl",
    };
    for (const std::string& str : CASES) {
        const auto dec = bech32::Decode(str);
        BOOST_CHECK(dec.encoding == bech32::Encoding::BECH32);
        std::string recode = bech32::Encode(bech32::Encoding::BECH32, dec.hrp, dec.data);
        BOOST_CHECK(!recode.empty());
        BOOST_CHECK(CaseInsensitiveEqual(str, recode));
    }
}